

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O0

void __thiscall
SignParameter_OpCodeConstructorTest_Test::TestBody(SignParameter_OpCodeConstructorTest_Test *this)

{
  ByteData expect_bytedata_msig;
  bool in_stack_0000019f;
  Pubkey *in_stack_000001a0;
  SignDataType in_stack_000001ac;
  ByteData *in_stack_000001b0;
  SignParameter *in_stack_000001b8;
  anon_class_1_0_00000001 *in_stack_000001c0;
  SigHashType *in_stack_000001d0;
  ByteData expect_bytedata_true;
  SignParameter sign_parameter;
  ByteData expect_bytedata_00;
  SignParameter *pSVar1;
  SigHashType local_2b4;
  Pubkey local_2a8 [2];
  ScriptOperator *in_stack_fffffffffffffd98;
  SignParameter *in_stack_fffffffffffffda0;
  SignParameter *in_stack_fffffffffffffdb8;
  SignParameter *in_stack_fffffffffffffdc0;
  allocator local_211;
  string local_210;
  undefined1 local_1f0 [40];
  Pubkey local_1c8 [6];
  allocator local_131;
  string local_130;
  undefined1 local_110 [40];
  Pubkey local_e8 [6];
  allocator local_41;
  string local_40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"00",&local_41);
  cfd::core::ByteData::ByteData((ByteData *)&stack0xffffffffffffffe0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  cfd::SignParameter::SignParameter(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  cfd::core::Pubkey::Pubkey(local_e8);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_110 + 0x1c));
  pSVar1 = (SignParameter *)&stack0xffffffffffffffe0;
  ::anon_class_1_0_00000001::operator()
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001ac,
             in_stack_000001a0,in_stack_0000019f,in_stack_000001d0,
             (ByteData *)
             expect_bytedata_true.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2063ce);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"51",&local_131);
  cfd::core::ByteData::ByteData((ByteData *)local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  cfd::SignParameter::SignParameter(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  cfd::SignParameter::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  cfd::SignParameter::~SignParameter(pSVar1);
  cfd::core::Pubkey::Pubkey(local_1c8);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_1f0 + 0x1c));
  pSVar1 = (SignParameter *)local_110;
  ::anon_class_1_0_00000001::operator()
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001ac,
             in_stack_000001a0,in_stack_0000019f,in_stack_000001d0,
             (ByteData *)
             expect_bytedata_true.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2064d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"ae",&local_211);
  cfd::core::ByteData::ByteData((ByteData *)local_1f0,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  cfd::SignParameter::SignParameter(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  cfd::SignParameter::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  cfd::SignParameter::~SignParameter(pSVar1);
  cfd::core::Pubkey::Pubkey(local_2a8);
  cfd::core::SigHashType::SigHashType(&local_2b4);
  pSVar1 = (SignParameter *)local_1f0;
  ::anon_class_1_0_00000001::operator()
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001ac,
             in_stack_000001a0,in_stack_0000019f,in_stack_000001d0,
             (ByteData *)
             expect_bytedata_true.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2065bc);
  cfd::core::ByteData::~ByteData((ByteData *)0x2065c9);
  cfd::core::ByteData::~ByteData((ByteData *)0x2065d6);
  cfd::SignParameter::~SignParameter(pSVar1);
  cfd::core::ByteData::~ByteData((ByteData *)0x2065f0);
  return;
}

Assistant:

TEST(SignParameter, OpCodeConstructorTest)
{
  const ByteData expect_bytedata_00("00");
  // constructor
  SignParameter sign_parameter = SignParameter(ScriptOperator::OP_0);
  CompareSignparameter(sign_parameter, expect_bytedata_00,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_00);

  const ByteData expect_bytedata_true("51");
  // constructor
  sign_parameter = SignParameter(ScriptOperator::OP_TRUE);
  CompareSignparameter(sign_parameter, expect_bytedata_true,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_true);

  const ByteData expect_bytedata_msig("ae");
  // constructor
  sign_parameter = SignParameter(ScriptOperator::OP_CHECKMULTISIG);
  CompareSignparameter(sign_parameter, expect_bytedata_msig,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_msig);
}